

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::testRunStarting(XmlReporter *this,TestRunInfo *testInfo)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  element_type *peVar5;
  string *attribute;
  long *in_RDI;
  long in_FS_OFFSET;
  string stylesheetRef;
  string *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  XmlFormatting in_stack_fffffffffffffe24;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  XmlWriter *in_stack_fffffffffffffe30;
  ScopedElement *this_00;
  XmlFormatting fmt;
  string *psVar6;
  undefined4 in_stack_fffffffffffffe48;
  string *in_stack_fffffffffffffe50;
  string *in_stack_fffffffffffffe58;
  XmlWriter *in_stack_fffffffffffffe60;
  XmlWriter *this_01;
  allocator *in_stack_fffffffffffffe78;
  undefined1 local_15a;
  undefined1 local_159 [18];
  undefined1 local_147 [31];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  string local_28 [32];
  long local_8;
  undefined4 extraout_var;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  StreamingReporterBase<Catch::XmlReporter>::testRunStarting
            ((StreamingReporterBase<Catch::XmlReporter> *)
             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (TestRunInfo *)in_stack_fffffffffffffe18);
  (**(code **)(*in_RDI + 0x90))(local_28);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    XmlWriter::writeStylesheetRef
              ((XmlWriter *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
               in_stack_fffffffffffffe18);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"Catch",(allocator *)(local_147 + 2));
  operator|(Newline,Indent);
  XmlWriter::startElement
            (in_stack_fffffffffffffe30,
             (string *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
             in_stack_fffffffffffffe24);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)(local_147 + 2));
  peVar5 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x254e68);
  (*(peVar5->super_NonCopyable)._vptr_NonCopyable[4])(local_68);
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string(local_68);
  if (((bVar1 ^ 0xff) & 1) != 0) {
    in_stack_fffffffffffffe78 = (allocator *)(local_147 + 1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"name",in_stack_fffffffffffffe78);
    peVar5 = clara::std::
             __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x254efc);
    (*(peVar5->super_NonCopyable)._vptr_NonCopyable[4])(local_a8);
    XmlWriter::writeAttribute
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)(local_147 + 1));
  }
  peVar5 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x255020);
  (*(peVar5->super_NonCopyable)._vptr_NonCopyable[0xd])();
  bVar2 = TestSpec::hasFilters((TestSpec *)0x25503d);
  if (bVar2) {
    psVar6 = (string *)(in_RDI + 0x2e);
    this_01 = (XmlWriter *)local_147;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"filters",(allocator *)this_01);
    peVar5 = clara::std::
             __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x255097);
    iVar3 = (*(peVar5->super_NonCopyable)._vptr_NonCopyable[0xf])();
    attribute = (string *)CONCAT44(extraout_var,iVar3);
    serializeFilters((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffe78);
    XmlWriter::writeAttribute(this_01,psVar6,attribute);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)local_147);
  }
  peVar5 = clara::std::
           __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x255180);
  iVar3 = (*(peVar5->super_NonCopyable)._vptr_NonCopyable[0x11])();
  if (iVar3 != 0) {
    fmt = (XmlFormatting)((ulong)(in_RDI + 0x2e) >> 0x20);
    psVar6 = (string *)local_159;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"Randomness",(allocator *)psVar6);
    operator|(Newline,Indent);
    XmlWriter::scopedElement((XmlWriter *)CONCAT44(iVar3,in_stack_fffffffffffffe48),psVar6,fmt);
    this_00 = (ScopedElement *)&local_15a;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_128,"seed",(allocator *)this_00);
    peVar5 = clara::std::
             __shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x25524d);
    iVar3 = (*(peVar5->super_NonCopyable)._vptr_NonCopyable[0x11])();
    XmlWriter::ScopedElement::writeAttribute<unsigned_int>
              (this_00,(string *)CONCAT44(iVar3,in_stack_fffffffffffffe28),
               (uint *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_15a);
    XmlWriter::ScopedElement::~ScopedElement
              ((ScopedElement *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)local_159);
  }
  std::__cxx11::string::~string(local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void XmlReporter::testRunStarting( TestRunInfo const& testInfo ) {
        StreamingReporterBase::testRunStarting( testInfo );
        std::string stylesheetRef = getStylesheetRef();
        if( !stylesheetRef.empty() )
            m_xml.writeStylesheetRef( stylesheetRef );
        m_xml.startElement( "Catch" );
        if( !m_config->name().empty() )
            m_xml.writeAttribute( "name", m_config->name() );
        if (m_config->testSpec().hasFilters())
            m_xml.writeAttribute( "filters", serializeFilters( m_config->getTestsOrTags() ) );
        if( m_config->rngSeed() != 0 )
            m_xml.scopedElement( "Randomness" )
                .writeAttribute( "seed", m_config->rngSeed() );
    }